

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pznonlinanalysis.cpp
# Opt level: O2

void __thiscall
TPZNonLinearAnalysis::ComputeTangent
          (TPZNonLinearAnalysis *this,TPZFMatrix<double> *tangent,TPZVec<double> *coefs,int icase)

{
  TPZStructMatrix *pTVar1;
  int64_t iVar2;
  long lVar3;
  TPZAutoPointer<TPZGuiInterface> local_b0;
  TPZFMatrix<double> rhs;
  
  iVar2 = TPZCompMesh::NEquations((this->super_TPZLinearAnalysis).super_TPZAnalysis.fCompMesh);
  lVar3 = (long)(int)iVar2;
  (*(tangent->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable[0xe])
            (tangent,lVar3,lVar3);
  TPZFMatrix<double>::TPZFMatrix(&rhs,lVar3,1);
  pTVar1 = ((this->super_TPZLinearAnalysis).super_TPZAnalysis.fStructMatrix.fRef)->fPointer;
  lVar3 = *(long *)(*(long *)pTVar1 + -0x60);
  TPZAutoPointer<TPZGuiInterface>::TPZAutoPointer(&local_b0,(TPZGuiInterface *)0x0);
  (**(code **)(*(long *)((long)&pTVar1->field_0x0 + lVar3) + 0x48))
            ((long)&pTVar1->field_0x0 + lVar3,tangent,&rhs,&local_b0);
  TPZAutoPointer<TPZGuiInterface>::~TPZAutoPointer(&local_b0);
  TPZFMatrix<double>::~TPZFMatrix(&rhs);
  return;
}

Assistant:

void TPZNonLinearAnalysis::ComputeTangent(TPZFMatrix<STATE> &tangent, TPZVec<REAL> &coefs, int icase){
	
	int neq = fCompMesh->NEquations();
	tangent.Redim(neq,neq);
	TPZFMatrix<STATE> rhs(neq,1);
	fStructMatrix->Assemble(tangent,rhs,NULL);
}